

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O3

uint256 * __thiscall
CCoinsViewCache::GetBestBlock(uint256 *__return_storage_ptr__,CCoinsViewCache *this)

{
  uint256 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uchar *puVar9;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = &this->hashBlock;
  puVar9 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (puVar1,&this->field_0x31);
  if (puVar9 == &this->field_0x31) {
    (*((this->super_CCoinsViewBacked).base)->_vptr_CCoinsView[2])(&local_48);
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x10) = local_38;
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_30;
    *(undefined8 *)(puVar1->super_base_blob<256U>).m_data._M_elems = local_48;
    *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 8) = uStack_40;
  }
  uVar2 = *(undefined4 *)(puVar1->super_base_blob<256U>).m_data._M_elems;
  uVar3 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 4);
  uVar4 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 8);
  uVar5 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0xc);
  uVar6 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x14);
  uVar7 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x18);
  uVar8 = *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x1c);
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
       *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x14) = uVar6;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar7;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x1c) = uVar8;
  *(undefined4 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar2;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 4) = uVar3;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar4;
  *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0xc) = uVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 CCoinsViewCache::GetBestBlock() const {
    if (hashBlock.IsNull())
        hashBlock = base->GetBestBlock();
    return hashBlock;
}